

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

BIT_DStream_status BIT_reloadDStreamFast(BIT_DStream_t *bitD)

{
  uint uVar1;
  char *pcVar2;
  
  pcVar2 = bitD->ptr;
  if (bitD->limitPtr <= pcVar2) {
    uVar1 = bitD->bitsConsumed;
    bitD->ptr = pcVar2 + -(ulong)(uVar1 >> 3);
    bitD->bitsConsumed = uVar1 & 7;
    pcVar2 = *(char **)(pcVar2 + -(ulong)(uVar1 >> 3));
    bitD->bitContainer = (size_t)pcVar2;
  }
  return (BIT_DStream_status)pcVar2;
}

Assistant:

MEM_STATIC BIT_DStream_status BIT_reloadDStreamFast(BIT_DStream_t* bitD)
{
    if (UNLIKELY(bitD->ptr < bitD->limitPtr))
        return BIT_DStream_overflow;
    assert(bitD->bitsConsumed <= sizeof(bitD->bitContainer)*8);
    bitD->ptr -= bitD->bitsConsumed >> 3;
    bitD->bitsConsumed &= 7;
    bitD->bitContainer = MEM_readLEST(bitD->ptr);
    return BIT_DStream_unfinished;
}